

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O3

void __thiscall baryonyx::problem::problem(problem *this,problem *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  problem_solver_type pVar3;
  
  p_Var2 = (param_1->strings).
           super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  p_Var1 = (param_1->strings).
           super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::
  vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ::vector(&(this->objective).elements,&(param_1->objective).elements);
  std::
  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  ::vector(&(this->objective).qelements,&(param_1->objective).qelements);
  (this->objective).value = (param_1->objective).value;
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->equal_constraints,&param_1->equal_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->greater_constraints,&param_1->greater_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->less_constraints,&param_1->less_constraints);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&(this->vars).names,&(param_1->vars).names);
  std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::vector
            (&(this->vars).values,&(param_1->vars).values);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&(this->affected_vars).names,&(param_1->affected_vars).names);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&(this->affected_vars).values,&(param_1->affected_vars).values);
  pVar3 = param_1->problem_type;
  this->type = param_1->type;
  this->problem_type = pVar3;
  return;
}

Assistant:

problem() = default;